

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop_measures.cc
# Opt level: O2

bool __thiscall S2::IsOrderLess(S2 *this,LoopOrder order1,LoopOrder order2,S2PointLoopSpan loop)

{
  bool bVar1;
  BasicVector<Vector3,_double,_3UL> *pBVar2;
  reference pVVar3;
  byte bVar4;
  ulong uVar5;
  int iVar6;
  int i;
  int i_00;
  S2PointLoopSpan loop_local;
  S2LogMessage local_40;
  
  loop_local.super_S2PointSpan.len_ = (size_type)loop.super_S2PointSpan.ptr_;
  if ((LoopOrder)this == order1) {
    bVar1 = false;
  }
  else {
    i_00 = (int)this;
    loop_local.super_S2PointSpan.ptr_ = (pointer)order2;
    pBVar2 = (BasicVector<Vector3,_double,_3UL> *)S2PointLoopSpan::operator[](&loop_local,i_00);
    i = order1.first;
    pVVar3 = S2PointLoopSpan::operator[](&loop_local,i);
    bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator==
                      (pBVar2,pVVar3);
    if (!bVar1) {
      S2LogMessage::S2LogMessage
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2loop_measures.cc"
                 ,0xfd,kFatal,(ostream *)&std::cerr);
      std::operator<<(local_40.stream_,"Check failed: (loop[i1]) == (loop[i2]) ");
      abort();
    }
    uVar5 = (ulong)order1 >> 0x20;
    iVar6 = (int)loop_local.super_S2PointSpan.len_ + 1;
    do {
      i_00 = i_00 + (int)((ulong)this >> 0x20);
      i = i + order1.dir;
      bVar4 = (byte)uVar5;
      iVar6 = iVar6 + -1;
      if (iVar6 < 2) goto LAB_0023f236;
      pBVar2 = (BasicVector<Vector3,_double,_3UL> *)S2PointLoopSpan::operator[](&loop_local,i_00);
      pVVar3 = S2PointLoopSpan::operator[](&loop_local,i);
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator<
                        (pBVar2,pVVar3);
      if (bVar1) {
        bVar4 = 1;
        goto LAB_0023f236;
      }
      pVVar3 = S2PointLoopSpan::operator[](&loop_local,i_00);
      pBVar2 = (BasicVector<Vector3,_double,_3UL> *)S2PointLoopSpan::operator[](&loop_local,i);
      bVar1 = util::math::internal_vector::BasicVector<Vector3,_double,_3UL>::operator<
                        (pBVar2,pVVar3);
    } while (!bVar1);
    bVar4 = 0;
LAB_0023f236:
    bVar1 = (bool)(1 < iVar6 & bVar4);
  }
  return bVar1;
}

Assistant:

static inline bool IsOrderLess(LoopOrder order1, LoopOrder order2,
                               S2PointLoopSpan loop) {
  if (order1 == order2) return false;

  int i1 = order1.first, i2 = order2.first;
  int dir1 = order1.dir, dir2 = order2.dir;
  S2_DCHECK_EQ(loop[i1], loop[i2]);
  for (int n = loop.size(); --n > 0; ) {
    i1 += dir1;
    i2 += dir2;
    if (loop[i1] < loop[i2]) return true;
    if (loop[i1] > loop[i2]) return false;
  }
  return false;
}